

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Cluster.c
# Opt level: O0

void Llb_ManClusterCompress(Llb_Mtr_t *p)

{
  int local_18;
  int local_14;
  int k;
  int i;
  Llb_Mtr_t *p_local;
  
  local_18 = 0;
  local_14 = 0;
  do {
    if (p->nCols <= local_14) {
      p->nCols = local_18;
      return;
    }
    if (p->pColGrps[local_14] == (Llb_Grp_t *)0x0) {
      if (p->pColSums[local_14] != 0) {
        __assert_fail("p->pColSums[i] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Cluster.c"
                      ,300,"void Llb_ManClusterCompress(Llb_Mtr_t *)");
      }
      if (p->pMatrix[local_14] == (char *)0x0) {
        __assert_fail("p->pMatrix[i] != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Cluster.c"
                      ,0x12d,"void Llb_ManClusterCompress(Llb_Mtr_t *)");
      }
      if (p->pMatrix[local_14] != (char *)0x0) {
        free(p->pMatrix[local_14]);
        p->pMatrix[local_14] = (char *)0x0;
      }
    }
    else {
      p->pMatrix[local_18] = p->pMatrix[local_14];
      p->pColGrps[local_18] = p->pColGrps[local_14];
      p->pColSums[local_18] = p->pColSums[local_14];
      local_18 = local_18 + 1;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

void Llb_ManClusterCompress( Llb_Mtr_t * p )
{
    int i, k = 0;
    for ( i = 0; i < p->nCols; i++ )
    {
        if ( p->pColGrps[i] == NULL )
        {
            assert( p->pColSums[i] == 0 );
            assert( p->pMatrix[i] != NULL );
            ABC_FREE( p->pMatrix[i] );
            continue;
        }
        p->pMatrix[k]  = p->pMatrix[i];
        p->pColGrps[k] = p->pColGrps[i];
        p->pColSums[k] = p->pColSums[i];
        k++;
    }
    p->nCols = k;
}